

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

QByteArray *
makeCacheKey(QByteArray *__return_storage_ptr__,QUrl *url,QNetworkProxy *proxy,
            QString *peerVerifyName)

{
  char (*pacVar1) [17];
  char *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  char cVar7;
  ProxyType PVar8;
  storage_type *psVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QLatin1String QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QUrl key;
  QUrl copy;
  QStringBuilder<const_char_(&)[17],_QByteArray> local_f8;
  QString local_d0;
  QArrayData *local_b8;
  Algorithm local_b0;
  storage_type *local_a8;
  QUrl local_a0;
  QString local_98;
  QArrayData *local_78;
  storage_type_conflict *psStack_70;
  undefined1 *local_68;
  QUrl local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_60.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_60,url);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_70 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::scheme();
  if (local_68 == (undefined1 *)0x10) {
    QVar11.m_data = psStack_70;
    QVar11.m_size = 0x10;
    QVar20.m_data = "preconnect-https";
    QVar20.m_size = 0x10;
    QtPrivate::equalStrings(QVar11,QVar20);
  }
  else if (local_68 == (undefined1 *)0x5) {
    QVar10.m_data = psStack_70;
    QVar10.m_size = 5;
    QVar19.m_data = "https";
    QVar19.m_size = 5;
    QtPrivate::equalStrings(QVar10,QVar19);
  }
  QVar12.m_data = &DAT_00000004;
  QVar12.m_size = (qsizetype)&local_78;
  cVar7 = QString::startsWith(QVar12,0x25edcb);
  if (cVar7 == '\0') {
    QUrl::port((int)&local_60);
    QUrl::setPort((int)&local_60);
  }
  if (local_68 == (undefined1 *)0x10) {
    QVar14.m_data = psStack_70;
    QVar14.m_size = 0x10;
    QVar22.m_data = "preconnect-https";
    QVar22.m_size = 0x10;
    cVar7 = QtPrivate::equalStrings(QVar14,QVar22);
    if (cVar7 != '\0') {
      psVar9 = (storage_type *)0x5;
      goto LAB_00212e85;
    }
  }
  else if ((local_68 == (undefined1 *)0xf) &&
          (QVar13.m_data = psStack_70, QVar13.m_size = 0xf, QVar21.m_data = "preconnect-http",
          QVar21.m_size = 0xf, cVar7 = QtPrivate::equalStrings(QVar13,QVar21), cVar7 != '\0')) {
    psVar9 = &DAT_00000004;
LAB_00212e85:
    QVar15.m_data = psVar9;
    QVar15.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar15);
    local_98.d.d = (Data *)local_f8.a;
    local_98.d.ptr = (char16_t *)local_f8.b.d.d;
    local_98.d.size = (qsizetype)local_f8.b.d.ptr;
    QUrl::setScheme((QString *)&local_60);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QUrl::toString(&local_f8,&local_60,0x1f000e6);
  pcVar6 = local_58.d.ptr;
  pDVar3 = local_58.d.d;
  pcVar2 = local_f8.b.d.ptr;
  pacVar1 = local_f8.a;
  local_f8.a = (char (*) [17])local_58.d.d;
  local_58.d.d = (Data *)pacVar1;
  local_58.d.ptr = (char16_t *)local_f8.b.d.d;
  local_f8.b.d.d = (Data *)pcVar6;
  local_f8.b.d.ptr = (char *)local_58.d.size;
  local_58.d.size = (qsizetype)pcVar2;
  if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if ((proxy == (QNetworkProxy *)0x0) || (PVar8 = QNetworkProxy::type(proxy), PVar8 == NoProxy))
  goto LAB_0021327f;
  local_a0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_a0);
  PVar8 = QNetworkProxy::type(proxy);
  if (PVar8 - HttpProxy < 2) {
    psVar9 = (storage_type *)0xa;
LAB_00212fa3:
    QVar16.m_data = psVar9;
    QVar16.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar16);
    local_98.d.d = (Data *)local_f8.a;
    local_98.d.ptr = (char16_t *)local_f8.b.d.d;
    local_98.d.size = (qsizetype)local_f8.b.d.ptr;
    QUrl::setScheme((QString *)&local_a0);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else if (PVar8 == Socks5Proxy) {
    psVar9 = (storage_type *)0xc;
    goto LAB_00212fa3;
  }
  QUrl::scheme();
  pcVar2 = local_f8.b.d.ptr;
  if ((QArrayData *)local_f8.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)*local_f8.a)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)*local_f8.a)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)*local_f8.a)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.a,2,0x10);
    }
  }
  if (pcVar2 != (storage_type *)0x0) {
    local_f8.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_f8.a = (char (*) [17])&DAT_aaaaaaaaaaaaaaaa;
    local_f8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxy::password(&local_d0,proxy);
    QString::toUtf8_helper((QString *)&local_b8);
    QVar17.m_data = local_a8;
    QVar17.m_size = (qsizetype)&local_98;
    QCryptographicHash::hash(QVar17,local_b0);
    QByteArray::toHex((char)&local_f8);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,1,0x10);
      }
    }
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
      }
    }
    QNetworkProxy::user(&local_98,proxy);
    QUrl::setUserName((QString *)&local_a0,(ParsingMode)&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QVar18.m_data = local_f8.b.d.ptr;
    QVar18.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar18);
    QUrl::setPassword((QString *)&local_a0,(ParsingMode)&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QNetworkProxy::hostName(&local_98,proxy);
    QUrl::setHost((QString *)&local_a0,(ParsingMode)&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QNetworkProxy::port(proxy);
    QUrl::setPort((int)&local_a0);
    QUrl::setQuery((QString *)&local_a0,(ParsingMode)&local_58);
    QUrl::toString(&local_98,&local_a0,0x1f00000);
    pcVar6 = local_58.d.ptr;
    pDVar5 = local_58.d.d;
    qVar4 = local_98.d.size;
    pDVar3 = local_98.d.d;
    local_98.d.d = local_58.d.d;
    local_58.d.d = pDVar3;
    local_58.d.ptr = local_98.d.ptr;
    local_98.d.ptr = pcVar6;
    local_98.d.size = local_58.d.size;
    local_58.d.size = qVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_f8.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_f8.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_f8.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_f8.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.a,1,0x10);
      }
    }
  }
  QUrl::~QUrl(&local_a0);
LAB_0021327f:
  if ((peerVerifyName->d).size != 0) {
    local_f8.a = (char (*) [17])CONCAT62(local_f8.a._2_6_,0x3a);
    local_f8.b.d.d = (Data *)peerVerifyName;
    operator+=(&local_58,(QStringBuilder<char16_t,_const_QString_&> *)&local_f8);
  }
  QString::toLatin1_helper_inplace((QString *)&local_98);
  local_f8.b.d.size = local_98.d.size;
  local_f8.b.d.ptr = (char *)local_98.d.ptr;
  local_f8.b.d.d = (Data *)local_98.d.d;
  local_f8.a = (char (*) [17])0x270223;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  QStringBuilder<const_char_(&)[17],_QByteArray>::convertTo<QByteArray>
            (__return_storage_ptr__,&local_f8);
  if (&(local_f8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.b.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  QUrl::~QUrl(&local_60);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray makeCacheKey(QUrl &url, QNetworkProxy *proxy, const QString &peerVerifyName)
{
    QString result;
    QUrl copy = url;
    QString scheme = copy.scheme();
    bool isEncrypted = scheme == "https"_L1 || scheme == "preconnect-https"_L1;
    const bool isLocalSocket = scheme.startsWith("unix"_L1);
    if (!isLocalSocket)
        copy.setPort(copy.port(isEncrypted ? 443 : 80));
    if (scheme == "preconnect-http"_L1)
        copy.setScheme("http"_L1);
    else if (scheme == "preconnect-https"_L1)
        copy.setScheme("https"_L1);
    result = copy.toString(QUrl::RemoveUserInfo | QUrl::RemovePath |
                           QUrl::RemoveQuery | QUrl::RemoveFragment | QUrl::FullyEncoded);

#ifndef QT_NO_NETWORKPROXY
    if (proxy && proxy->type() != QNetworkProxy::NoProxy) {
        QUrl key;

        switch (proxy->type()) {
        case QNetworkProxy::Socks5Proxy:
            key.setScheme("proxy-socks5"_L1);
            break;

        case QNetworkProxy::HttpProxy:
        case QNetworkProxy::HttpCachingProxy:
            key.setScheme("proxy-http"_L1);
            break;

        default:
            break;
        }

        if (!key.scheme().isEmpty()) {
            const QByteArray obfuscatedPassword = QCryptographicHash::hash(proxy->password().toUtf8(),
                                                                           QCryptographicHash::Sha1).toHex();
            key.setUserName(proxy->user());
            key.setPassword(QString::fromUtf8(obfuscatedPassword));
            key.setHost(proxy->hostName());
            key.setPort(proxy->port());
            key.setQuery(result);
            result = key.toString(QUrl::FullyEncoded);
        }
    }
#else
    Q_UNUSED(proxy);
#endif
    if (!peerVerifyName.isEmpty())
        result += u':' + peerVerifyName;
    return "http-connection:" + std::move(result).toLatin1();
}